

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::dumpBuffer
          (CLIntercept *this,string *name,uint64_t enqueueCounter,cl_mem memobj,
          cl_command_queue command_queue,void *ptr,size_t offset,size_t size)

{
  _Rb_tree_header *p_Var1;
  size_t size_00;
  CLIntercept *this_00;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  mapped_type *pmVar5;
  mapped_type_conflict *pmVar6;
  void *ptr_00;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  pthread_mutex_t *__mutex;
  string fileName;
  char bufferName [256];
  allocator local_199;
  string local_198;
  cl_mem local_178;
  cl_command_queue local_170;
  pthread_mutex_t *local_168;
  CBufferInfoMap *local_160;
  void *local_158;
  CLIntercept *local_150;
  uint64_t local_148;
  string *local_140;
  undefined1 local_138 [264];
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_178 = memobj;
  local_148 = enqueueCounter;
  local_140 = name;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    p_Var3 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      do {
        if (*(cl_mem *)(p_Var3 + 1) >= memobj) {
          p_Var8 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[*(cl_mem *)(p_Var3 + 1) < memobj];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 != p_Var1) && (*(cl_mem *)(p_Var8 + 1) <= memobj)) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_168 = __mutex;
        local_160 = &this->m_BufferInfoMap;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
        std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,&local_199);
        OS::Services_Common::GetDumpDirectoryName
                  (&(this->m_OS).super_Services_Common,(string *)local_138,&local_198);
        local_158 = ptr;
        if ((cl_mem)local_138._0_8_ != (cl_mem)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        std::__cxx11::string::append((char *)&local_198);
        local_170 = command_queue;
        local_150 = this;
        lVar4 = std::__cxx11::string::find((char *)&local_198,0x19d01b,0);
        lVar4 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar4 + 1);
        if (lVar4 != -1) {
          do {
            std::__cxx11::string::substr((ulong)local_138,(ulong)&local_198);
            mkdir((char *)local_138._0_8_,0x1ff);
            if ((cl_mem)local_138._0_8_ != (cl_mem)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
            }
            lVar4 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar4 + 1);
          } while (lVar4 != -1);
        }
        __mutex = local_168;
        std::__cxx11::string::_M_append((char *)&local_198,(ulong)(local_140->_M_dataplus)._M_p);
        this_00 = local_150;
        local_138._0_8_ = memobj;
        pmVar5 = std::
                 map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                 ::operator[](&local_150->m_MemAllocNumberMap,(key_type *)local_138);
        snprintf(local_138,0x100,"%04u",(ulong)*pmVar5);
        std::__cxx11::string::append((char *)&local_198);
        std::__cxx11::string::append((char *)&local_198);
        snprintf(local_138,0x100,"%04zu",offset);
        std::__cxx11::string::append((char *)&local_198);
        std::__cxx11::string::append((char *)&local_198);
        snprintf(local_138,0x100,"%04u",local_148);
        std::__cxx11::string::append((char *)&local_198);
        std::__cxx11::string::append((char *)&local_198);
        std::__cxx11::string::append((char *)&local_198);
        if (size == 0 || local_158 == (void *)0x0) {
          pmVar6 = std::
                   map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                   ::operator[](local_160,&local_178);
          size_00 = *pmVar6;
          local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
          ptr_00 = (*(this_00->m_Dispatch).clEnqueueMapBuffer)
                             (local_170,local_178,1,1,0,size_00,0,(cl_event *)0x0,(cl_event *)0x0,
                              (cl_int *)local_138);
          if (local_138._0_4_ == 0) {
            dumpMemoryToFile(this_00,&local_198,(this_00->m_Config).DumpBufferHashes,ptr_00,size_00)
            ;
            (*(this_00->m_Dispatch).clEnqueueUnmapMemObject)
                      (local_170,local_178,ptr_00,0,(cl_event *)0x0,(cl_event *)0x0);
          }
        }
        else {
          dumpMemoryToFile(this_00,&local_198,(this_00->m_Config).DumpBufferHashes,local_158,size);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar7 = std::__throw_system_error(iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_168);
  _Unwind_Resume(uVar7);
}

Assistant:

void CLIntercept::dumpBuffer(
    const std::string& name,
    const uint64_t enqueueCounter,
    cl_mem memobj,
    cl_command_queue command_queue,
    void* ptr,
    size_t offset,
    size_t size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
    {
        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/memDumpCreateMapUnmap/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        fileName += name;

        // Add the buffer number to the file name
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            char    bufferName[ MAX_PATH ];

            CLI_SPRINTF( bufferName, MAX_PATH, "%04u", number );

            fileName += "_Buffer_";
            fileName += bufferName;
        }

        // Add the offset to the file name
        {
            char    offsetName[ MAX_PATH ];

            CLI_SPRINTF( offsetName, MAX_PATH, "%04zu",
                offset );

            fileName += "_Offset_";
            fileName += offsetName;
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );

            fileName += "_Enqueue_";
            fileName += enqueueCount;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        // There are two possibilities:
        // 1) We have a pointer and size already.  This might happen
        //    when the buffer is being created or was just mapped.
        //    In this case, we can just write this to the file.
        // 2) We have no pointer or size.  This usually happens when
        //    the buffer is being unmapped.  In this case, we'll
        //    map and dump the entire buffer.
        if( ptr != NULL && size != 0 )
        {
            dumpMemoryToFile(
                fileName,
                config().DumpBufferHashes,
                ptr,
                size );
        }
        else
        {
            // We should have checked this already...
            CLI_ASSERT( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() );

            size_t  size = m_BufferInfoMap[ memobj ];

            cl_int  error = CL_SUCCESS;
            ptr = dispatch().clEnqueueMapBuffer(
                command_queue,
                memobj,
                CL_TRUE,
                CL_MAP_READ,
                0,
                size,
                0,
                NULL,
                NULL,
                &error );
            if( error == CL_SUCCESS )
            {
                dumpMemoryToFile(
                    fileName,
                    config().DumpBufferHashes,
                    ptr,
                    size );

                dispatch().clEnqueueUnmapMemObject(
                    command_queue,
                    memobj,
                    ptr,
                    0,
                    NULL,
                    NULL );
            }
        }
    }
}